

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

int __thiscall
CTPNMember::gen_code_asi
          (CTPNMember *this,int discard,int phase,tc_asitype_t typ,char *op,CTcPrsNode *rhs,
          int ignore_errors,int param_8,void **ctx)

{
  int *piVar1;
  int iVar2;
  CTcPrsNode *pCVar3;
  CTcDataStream *this_00;
  size_t in_RCX;
  int in_EDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  int in_ESI;
  CTPNMemberBase *in_RDI;
  undefined8 *in_R9;
  undefined8 *in_stack_00000018;
  member_ca_ctx *cctx;
  vm_prop_id_t prop;
  vm_obj_id_t obj;
  int is_self;
  uchar in_stack_0000007f;
  undefined4 in_stack_00000084;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  CTcDataStream *in_stack_ffffffffffffff90;
  vm_prop_id_t local_3a;
  vm_obj_id_t local_38;
  int local_34;
  undefined8 *local_30;
  int local_1c;
  int local_18;
  int local_14;
  int local_4;
  
  local_1c = (int)in_RCX;
  local_30 = in_R9;
  local_18 = in_EDX;
  local_14 = in_ESI;
  if (in_EDX == 2) {
    piVar1 = (int *)*in_stack_00000018;
    local_34 = *piVar1;
    local_38 = piVar1[1];
    local_3a = *(vm_prop_id_t *)(piVar1 + 2);
    if (piVar1 != (int *)0x0) {
      operator_delete(piVar1,0xc);
    }
  }
  if ((local_1c == 0) && (local_30 != (undefined8 *)0x0)) {
    (**(code **)*local_30)(local_30,0);
  }
  if ((local_14 == 0) && ((local_1c == 0 || (local_18 == 2)))) {
    CTcGenTarg::write_op((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
    CTcGenTarg::note_push((CTcGenTarg *)0x2d5f91);
  }
  if ((local_1c == 0) || (local_18 == 1)) {
    pCVar3 = CTPNMemberBase::get_obj_expr(in_RDI);
    local_38 = (*(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x18])(pCVar3,&local_34);
    pCVar3 = CTPNMemberBase::get_prop_expr(in_RDI);
    iVar2 = (*(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x19])
                      (pCVar3,1,(ulong)(in_RDI->field_0x18 & 1));
    local_3a = (vm_prop_id_t)iVar2;
    if (local_3a == 0) {
      if (local_34 == 0) {
        if (local_38 != 0) {
          CTcGenTarg::write_op
                    ((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
          CTcDataStream::write_obj_id
                    (in_stack_ffffffffffffff90,
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          CTcGenTarg::note_push((CTcGenTarg *)0x2d6068);
        }
      }
      else {
        CTcGenTarg::write_op
                  ((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
        CTcGenTarg::note_push((CTcGenTarg *)0x2d6027);
      }
      pCVar3 = CTPNMemberBase::get_prop_expr(in_RDI);
      (*(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x19])
                (pCVar3,0,(ulong)(in_RDI->field_0x18 & 1));
      if (local_1c != 0) {
        CTcGenTarg::write_op
                  ((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
        CTcGenTarg::note_push(G_cg,2);
      }
    }
    else if (((local_1c != 0) && (local_34 == 0)) && (local_38 == 0)) {
      CTcGenTarg::write_op
                ((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
      CTcGenTarg::note_push((CTcGenTarg *)0x2d60f8);
    }
  }
  if ((local_1c == 0) || (local_18 != 1)) {
    if ((local_1c == 0) || (local_18 == 2)) {
      if (local_3a == 0) {
        if ((local_1c != 0) && (local_18 == 2)) {
          if (local_14 == 0) {
            CTcGenTarg::write_op
                      ((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
          }
          else {
            CTcGenTarg::write_op
                      ((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
            CTcDataStream::write(&G_cs->super_CTcDataStream,0,__buf_00,in_RCX);
            CTcDataStream::write(&G_cs->super_CTcDataStream,2,__buf_01,in_RCX);
            CTcGenTarg::write_op
                      ((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
          }
        }
        CTcGenTarg::write_op
                  ((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
        CTcGenTarg::note_pop(G_cg,3);
      }
      else {
        if (((local_18 == 2) && (local_34 == 0)) && (local_38 == 0)) {
          if (local_14 == 0) {
            CTcGenTarg::write_op
                      ((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
            CTcDataStream::write(&G_cs->super_CTcDataStream,0,__buf_02,in_RCX);
            CTcDataStream::write(&G_cs->super_CTcDataStream,2,__buf_03,in_RCX);
          }
          else {
            CTcGenTarg::write_op
                      ((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
          }
        }
        if (local_34 == 0) {
          if (local_38 == 0) {
            CTcGenTarg::write_op
                      ((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
            CTcDataStream::write_prop_id(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
            CTcGenTarg::note_pop(G_cg,2);
          }
          else {
            CTcGenTarg::write_op
                      ((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
            CTcDataStream::write_obj_id
                      (in_stack_ffffffffffffff90,
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
            CTcDataStream::write_prop_id(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
            CTcGenTarg::note_pop((CTcGenTarg *)0x2d6461);
          }
        }
        else {
          CTcGenTarg::write_op
                    ((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
          CTcDataStream::write_prop_id(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
          CTcGenTarg::note_pop((CTcGenTarg *)0x2d6409);
        }
      }
    }
    local_4 = 1;
  }
  else {
    this_00 = (CTcDataStream *)operator_new(0xc);
    member_ca_ctx::member_ca_ctx((member_ca_ctx *)this_00,local_34,local_38,local_3a);
    *in_stack_00000018 = this_00;
    if (local_3a == 0) {
      CTcGenTarg::write_op
                ((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
      CTcDataStream::write(&G_cs->super_CTcDataStream,0,__buf,(size_t)this_00);
      CTcGenTarg::note_pop(G_cg,2);
    }
    else if (local_34 == 0) {
      if (local_38 == 0) {
        CTcGenTarg::write_op
                  ((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
        CTcDataStream::write_prop_id(this_00,in_stack_ffffffffffffff8c);
        CTcGenTarg::note_pop((CTcGenTarg *)0x2d6263);
      }
      else {
        CTcGenTarg::write_op
                  ((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
        CTcDataStream::write_obj_id
                  (this_00,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        CTcDataStream::write_prop_id(this_00,in_stack_ffffffffffffff8c);
      }
    }
    else {
      CTcGenTarg::write_op
                ((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
      CTcDataStream::write_prop_id(this_00,in_stack_ffffffffffffff8c);
    }
    CTcGenTarg::write_op((CTcGenTarg *)CONCAT44(in_stack_00000084,ignore_errors),in_stack_0000007f);
    CTcGenTarg::note_push((CTcGenTarg *)0x2d628a);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CTPNMember::gen_code_asi(int discard, int phase,
                             tc_asitype_t typ, const char *op,
                             CTcPrsNode *rhs,
                             int ignore_errors, int, void **ctx)
{
    int is_self;
    vm_obj_id_t obj;
    vm_prop_id_t prop;

    /* if this is phase 2 of a compound assignment, retrieve the context */
    if (phase == 2)
    {
        /* cast the generic context pointer to our structure */
        member_ca_ctx *cctx = (member_ca_ctx *)*ctx;

        /* retrieve the context information */
        is_self = cctx->is_self;
        obj = cctx->obj;
        prop = cctx->prop;

        /* we're done with the context object - delete it */
        delete cctx;
    }

    /* 
     *   if this is a simple assignment, start by generating the right-hand
     *   side, unless the caller has already done so 
     */
    if (typ == TC_ASI_SIMPLE && rhs != 0)
        rhs->gen_code(FALSE, FALSE);

    /* 
     *   If this is a simple assignment, or it's phase 2 of a two-phase
     *   assignment, we now have the RHS at top of stack, and we're about to
     *   perform the actual assignment.  If the caller wants to further use
     *   the assigned value, push a copy, since we'll consume the RHS value
     *   currently on the stack with our SETPROP or related instruction. 
     */
    if (!discard && (typ == TC_ASI_SIMPLE || phase == 2))
    {
        G_cg->write_op(OPC_DUP);
        G_cg->note_push();
    }

    /*
     *   If this is a simple assignment, or phase 1 of a two-phase compound
     *   assignment, generate the object and property expressions. 
     */
    if (typ == TC_ASI_SIMPLE || phase == 1)
    {
        /* 
         *   Determine what we have on the left: we could have self, a
         *   constant object value, or any other expression.  
         */
        obj = get_obj_expr()->gen_code_obj_predot(&is_self);
        
        /* 
         *   determine what kind of property expression we have - don't
         *   generate any code for now, since we may need to generate some
         *   more code ahead of the property generation 
         */
        prop = get_prop_expr()->gen_code_propid(TRUE, prop_is_expr_);
        
        /* determine what we need to do based on the operands */
        if (prop == VM_INVALID_PROP)
        {
            /* 
             *   We're assigning through a property pointer -- we must
             *   generate a PTRSETPROP instruction.
             *   
             *   Before we generate the property expression, we must generate
             *   the object expression.  If we got a constant object, we must
             *   generate code to push that object value; otherwise, the code
             *   to generate the object value is already generated.  
             */
            if (is_self)
            {
                /* self - generate code to push the "self" value */
                G_cg->write_op(OPC_PUSHSELF);
                G_cg->note_push();
            }
            else if (obj != VM_INVALID_OBJ)
            {
                /* constant object - generate code to push the value */
                G_cg->write_op(OPC_PUSHOBJ);
                G_cs->write_obj_id(obj);
                G_cg->note_push();
            }

            /* generate the property value expression */
            get_prop_expr()->gen_code_propid(FALSE, prop_is_expr_);
            
            /*
             *   If this is phase 1 of a two-phase compound assignment, we'll
             *   need the object and property values that we've just stacked
             *   again in phase 2.  Save separate copies via DUP2.  
             */
            if (typ != TC_ASI_SIMPLE)
            {
                G_cg->write_op(OPC_DUP2);
                G_cg->note_push(2);
            }
        }
        else
        {
            /* 
             *   We're assigning to a fixed property ID.  If the object
             *   expression was not 'self' or a fixed object ID, we have an
             *   object value on the stack; otherwise we have nothing on the
             *   stack.
             *   
             *   For a two-phase assignment, we'll need the object value
             *   again during the second phase, so if we did indeed stack a
             *   value, make a copy of it for our use in phase 2.  
             */
            if (typ != TC_ASI_SIMPLE && !is_self && obj == VM_INVALID_OBJ)
            {
                G_cg->write_op(OPC_DUP);
                G_cg->note_push();
            }
        }
    }

    /*
     *   If this is phase 1 of a two-phase assignment, stop here: we've
     *   stacked the necessary obj and prop information for the actual
     *   assignment codegen in phase 2, and we've stacked the obj.prop value
     *   for the combination operator to access.  Save context information
     *   and return, telling the caller to proceed with the unrolled
     *   operation.  
     */
    if (typ != TC_ASI_SIMPLE && phase == 1)
    {
        /* save the object and property information in the phase context */
        *ctx = new member_ca_ctx(is_self, obj, prop);

        /* evaluate the property */
        if (prop == VM_INVALID_PROP)
        {
            /* property pointer - call with zero arguments */
            G_cg->write_op(OPC_PTRCALLPROP);
            G_cs->write(0);

            /* this pops the object and property */
            G_cg->note_pop(2);
        }
        else
        {
            /* constant property */
            if (is_self)
            {
                /* get property of self */
                G_cg->write_op(OPC_GETPROPSELF);
                G_cs->write_prop_id(prop);
            }
            else if (obj != VM_INVALID_OBJ)
            {
                /* constant object */
                G_cg->write_op(OPC_OBJGETPROP);
                G_cs->write_obj_id(obj);
                G_cs->write_prop_id(prop);
            }
            else
            {
                /* it's an object expression */
                G_cg->write_op(OPC_GETPROP);
                G_cs->write_prop_id(prop);

                /* this pops the object value */
                G_cg->note_pop();
            }
        }

        /* all of these leave the value in R0 - retrieve it */
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();

        /* tell the caller to proceed with the unrolled assignment */
        return FALSE;
    }

    /*
     *   If we're doing a simple assignment, or this is phase 2 of a compound
     *   assignment, it's time to do the actual assignment. 
     */
    if (typ == TC_ASI_SIMPLE || phase == 2)
    {
        /* determine how to make the assignment based on the operands */
        if (prop == VM_INVALID_PROP)
        {
            /*
             *   If this is phase 2 of a compound assignment, get the stack
             *   back in order.  We currently have (from bottom to top) obj
             *   prop RHS RHS (if !discard), or obj prop RHS (if discard).
             *   Swap the top one or two elements for the next two.  
             */
            if (typ != TC_ASI_SIMPLE && phase == 2)
            {
                if (discard)
                {
                    /* obj prop RHS -> RHS prop obj */
                    G_cg->write_op(OPC_SWAPN);
                    G_cs->write(0);
                    G_cs->write(2);
                    
                    /* RHS prop obj -> RHS obj prop */
                    G_cg->write_op(OPC_SWAP);
                }
                else
                {
                    /* obj prop RHS RHS -> RHS RHS obj prop */
                    G_cg->write_op(OPC_SWAP2);
                }
            }
                
            /* generate the PTRSETPROP instruction */
            G_cg->write_op(OPC_PTRSETPROP);

            /* ptrsetprop removes three elements */
            G_cg->note_pop(3);
        }
        else
        {
            /* constant property value */

            /* 
             *   If this is phase 2, and we have an object on the stack, we
             *   need to rearrange the stack into the proper order:
             *   
             *   !discard: stack = (obj RHS RHS), and we need (RHS RHS obj).
             *   
             *   discard: stack = (obj RHS), and we need (obj RHS).  Just do
             *   a SWAP.
             *   
             *   If there's no object on the stack, there's no need to do any
             *   rearrangement.  
             */
            if (phase == 2 && !is_self && obj == VM_INVALID_OBJ)
            {
                if (discard)
                {
                    /* obj RHS -> RHS obj */
                    G_cg->write_op(OPC_SWAP);
                }
                else
                {
                    /* obj RHS RHS -> RHS RHS obj */
                    G_cg->write_op(OPC_SWAPN);
                    G_cs->write(0);
                    G_cs->write(2);
                }
            }

            /* 
             *   We have several instructions to choose from.  If we're
             *   assigning to a property of "self", use SETPROPSELF.  If
             *   we're assigning to a constant object, use OBJSETPROP.
             *   Otherwise, use the plain SETPROP.
             */
            if (is_self)
            {
                /* write the SETPROPSELF */
                G_cg->write_op(OPC_SETPROPSELF);
                G_cs->write_prop_id(prop);

                /* setpropself removes the RHS value */
                G_cg->note_pop();
            }
            else if (obj != VM_INVALID_OBJ)
            {
                /* write the OBJSETPROP */
                G_cg->write_op(OPC_OBJSETPROP);
                G_cs->write_obj_id(obj);
                G_cs->write_prop_id(prop);

                /* objsetprop removes the RHS value */
                G_cg->note_pop();
            }
            else
            {
                /* 
                 *   write the normal SETPROP; we already generated the code
                 *   to push the object value, so it's where it should be 
                 */
                G_cg->write_op(OPC_SETPROP);
                G_cs->write_prop_id(prop);
                
                /* setprop removes the value and the object */
                G_cg->note_pop(2);
            }
        }
    }

    /* we're done with the operation */
    return TRUE;
}